

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  anon_struct_96_18_0d0905d3 *paVar1;
  byte bVar2;
  short sVar3;
  stbi_uc asVar4 [4];
  stbi_uc asVar5 [4];
  stbi__uint32 sVar6;
  bool bVar7;
  undefined4 uVar8;
  stbi__uint32 *psVar9;
  stbi__uint32 *psVar10;
  stbi_uc sVar11;
  byte bVar12;
  uchar uVar13;
  int iVar14;
  stbi__uint32 sVar15;
  uint uVar16;
  int iVar17;
  uint bits;
  stbi__jpeg *psVar18;
  char *pcVar19;
  long lVar20;
  stbi_uc *psVar21;
  stbi__context *psVar22;
  stbi__uint16 *data_00;
  void *pvVar23;
  code *pcVar24;
  float *data_01;
  uchar *data_02;
  uchar *puVar25;
  long lVar26;
  stbi_uc *psVar27;
  undefined8 uVar28;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint uVar29;
  uint uVar30;
  int iVar31;
  uint extraout_EDX_01;
  uint extraout_EDX_02;
  int why;
  anon_struct_96_18_0d0905d3 *extraout_RDX;
  anon_struct_96_18_0d0905d3 *extraout_RDX_00;
  anon_struct_96_18_0d0905d3 *extraout_RDX_01;
  anon_struct_96_18_0d0905d3 *paVar32;
  anon_struct_96_18_0d0905d3 *extraout_RDX_02;
  anon_struct_96_18_0d0905d3 *extraout_RDX_03;
  anon_struct_96_18_0d0905d3 *extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong extraout_RDX_07;
  ulong extraout_RDX_08;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  ulong extraout_RDX_11;
  ulong extraout_RDX_12;
  ulong extraout_RDX_13;
  ulong extraout_RDX_14;
  ulong extraout_RDX_15;
  stbi_uc *extraout_RDX_16;
  stbi_uc *extraout_RDX_17;
  stbi_uc *extraout_RDX_18;
  undefined1 auVar33 [8];
  ulong uVar34;
  ulong uVar35;
  int *piVar36;
  undefined1 *puVar37;
  byte *pbVar38;
  short *psVar39;
  long lVar40;
  int iVar41;
  undefined4 in_register_00000084;
  ulong uVar42;
  stbi__result_info *ri_00;
  ulong uVar43;
  int iVar44;
  int iVar45;
  stbi__uint16 *psVar46;
  stbi_uc (*pasVar47) [4];
  short sVar48;
  int iVar49;
  uint uVar50;
  long in_FS_OFFSET;
  bool bVar51;
  undefined1 auVar52 [16];
  stbi_uc *coutput [4];
  short data [64];
  void *local_8970;
  int local_8960;
  uint local_8948;
  int local_893c;
  ulong local_8938;
  undefined1 local_8918 [8];
  undefined8 uStack_8910;
  undefined8 local_8908;
  undefined8 uStack_8900;
  int local_88f8;
  stbi__uint32 *local_88e8;
  stbi__uint32 *local_88e0;
  int *local_88d8;
  uint local_88d0;
  int local_88cc;
  anon_struct_96_18_0d0905d3 *local_88c8;
  long local_88c0;
  int *local_88b8;
  uint local_88b0;
  uint local_88ac;
  stbi__gif local_88a8;
  
  psVar27 = (stbi_uc *)CONCAT44(in_register_00000084,req_comp);
  ri->channel_order = 0;
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  ri_00 = ri;
  local_88e8 = (stbi__uint32 *)x;
  local_88e0 = (stbi__uint32 *)y;
  local_88d8 = comp;
  psVar18 = (stbi__jpeg *)malloc(0x4888);
  psVar18->s = s;
  psVar18->idct_block_kernel = stbi__idct_simd;
  psVar18->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
  psVar18->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
  psVar18->jfif = 0;
  psVar18->app14_color_transform = -1;
  psVar18->marker = 0xff;
  sVar11 = stbi__get_marker(psVar18);
  if (sVar11 != 0xd8) {
    *(char **)(in_FS_OFFSET + -0x10) = "Corrupt JPEG";
  }
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  free(psVar18);
  if (sVar11 == 0xd8) {
    psVar18 = (stbi__jpeg *)malloc(0x4888);
    psVar18->s = s;
    psVar18->idct_block_kernel = stbi__idct_simd;
    psVar18->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
    psVar18->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
    s->img_n = 0;
    if ((uint)req_comp < 5) {
      paVar1 = psVar18->img_comp;
      lVar20 = 0x46d8;
      do {
        psVar27 = psVar18->huff_dc[0].fast + lVar20 + -8;
        psVar27[0] = '\0';
        psVar27[1] = '\0';
        psVar27[2] = '\0';
        psVar27[3] = '\0';
        psVar27[4] = '\0';
        psVar27[5] = '\0';
        psVar27[6] = '\0';
        psVar27[7] = '\0';
        psVar27[8] = '\0';
        psVar27[9] = '\0';
        psVar27[10] = '\0';
        psVar27[0xb] = '\0';
        psVar27[0xc] = '\0';
        psVar27[0xd] = '\0';
        psVar27[0xe] = '\0';
        psVar27[0xf] = '\0';
        lVar20 = lVar20 + 0x60;
      } while (lVar20 != 0x4858);
      psVar18->restart_interval = 0;
      iVar14 = stbi__decode_jpeg_header(psVar18,0);
      uVar50 = extraout_EDX;
      if (iVar14 != 0) {
        bVar12 = stbi__get_marker(psVar18);
        local_88b8 = psVar18->huff_ac[0].delta + 9;
LAB_0015b01c:
        if (bVar12 != 0xda) {
          if (bVar12 == 0xdc) {
            iVar14 = stbi__get16be(psVar18->s);
            sVar15 = stbi__get16be(psVar18->s);
            paVar32 = extraout_RDX;
            if ((iVar14 == 4) && (sVar15 == psVar18->s->img_y)) goto LAB_0015c354;
            goto LAB_0015c68b;
          }
          if (bVar12 == 0xd9) {
            if ((psVar18->progressive != 0) && (0 < psVar18->s->img_n)) {
              lVar20 = 0;
              do {
                iVar14 = psVar18->img_comp[lVar20].y + 7 >> 3;
                if (0 < iVar14) {
                  uVar50 = paVar1[lVar20].x + 7 >> 3;
                  iVar45 = 0;
                  do {
                    if (0 < (int)uVar50) {
                      uVar35 = 0;
                      do {
                        psVar39 = paVar1[lVar20].coeff +
                                  (paVar1[lVar20].coeff_w * iVar45 + (int)uVar35) * 0x40;
                        iVar44 = paVar1[lVar20].tq;
                        lVar26 = 0;
                        do {
                          psVar39[lVar26] = psVar39[lVar26] * psVar18->dequant[iVar44][lVar26];
                          lVar26 = lVar26 + 1;
                        } while (lVar26 != 0x40);
                        (*psVar18->idct_block_kernel)
                                  (paVar1[lVar20].data +
                                   uVar35 * 8 + (long)(iVar45 * 8 * paVar1[lVar20].w2),
                                   paVar1[lVar20].w2,psVar39);
                        uVar35 = uVar35 + 1;
                      } while (uVar35 != uVar50);
                    }
                    iVar45 = iVar45 + 1;
                  } while (iVar45 != iVar14);
                }
                lVar20 = lVar20 + 1;
              } while (lVar20 < psVar18->s->img_n);
            }
            if (req_comp == 0) {
              req_comp = (uint)(2 < psVar18->s->img_n) * 2 + 1;
            }
            uVar50 = psVar18->s->img_n;
            if (uVar50 == 3) {
              bVar51 = true;
              if (psVar18->rgb != 3) {
                if (psVar18->app14_color_transform != 0) goto LAB_0015c9a3;
                bVar51 = psVar18->jfif == 0;
              }
            }
            else {
LAB_0015c9a3:
              bVar51 = false;
            }
            uVar29 = 1;
            if (bVar51) {
              uVar29 = uVar50;
            }
            if (2 < req_comp) {
              uVar29 = uVar50;
            }
            if (uVar50 != 3) {
              uVar29 = uVar50;
            }
            local_8908 = (stbi_uc *)0x0;
            uStack_8900 = (stbi_uc *)0x0;
            local_8918 = (undefined1  [8])0x0;
            uStack_8910 = (stbi_uc *)0x0;
            if (0 < (int)uVar29) {
              local_8970 = (void *)0x0;
              lVar20 = 0;
              do {
                psVar22 = psVar18->s;
                sVar15 = psVar22->img_x;
                pvVar23 = malloc((ulong)(sVar15 + 3));
                *(void **)((long)&psVar18->img_comp[0].linebuf + lVar20 * 2) = pvVar23;
                if (pvVar23 == (void *)0x0) {
                  stbi__free_jpeg_components(psVar18,psVar22->img_n,why);
                  *(char **)(in_FS_OFFSET + -0x10) = "Out of memory";
                }
                else {
                  uVar35 = (long)psVar18->img_h_max /
                           (long)*(int *)((long)&psVar18->img_comp[0].h + lVar20 * 2);
                  iVar14 = (int)uVar35;
                  *(int *)((long)(local_88a8.pal + -7) + lVar20) = iVar14;
                  iVar45 = psVar18->img_v_max / *(int *)((long)&psVar18->img_comp[0].v + lVar20 * 2)
                  ;
                  *(int *)((long)(local_88a8.pal + -6) + lVar20) = iVar45;
                  *(int *)((long)(local_88a8.pal + -4) + lVar20) = iVar45 >> 1;
                  *(int *)((long)(local_88a8.pal + -5) + lVar20) =
                       (int)((ulong)((sVar15 + iVar14) - 1) / (uVar35 & 0xffffffff));
                  *(undefined4 *)((long)(local_88a8.pal + -3) + lVar20) = 0;
                  uVar28 = *(undefined8 *)((long)&psVar18->img_comp[0].data + lVar20 * 2);
                  *(undefined8 *)((long)(local_88a8.pal + -9) + lVar20) = uVar28;
                  *(undefined8 *)((long)(local_88a8.pal + -0xb) + lVar20) = uVar28;
                  if ((iVar14 == 1) && (iVar45 == 1)) {
                    pcVar24 = resample_row_1;
                  }
                  else if ((iVar14 == 1) && (iVar45 == 2)) {
                    pcVar24 = stbi__resample_row_v_2;
                  }
                  else if ((iVar14 == 2) && (iVar45 == 1)) {
                    pcVar24 = stbi__resample_row_h_2;
                  }
                  else if ((iVar14 == 2) && (iVar45 == 2)) {
                    pcVar24 = psVar18->resample_row_hv_2_kernel;
                  }
                  else {
                    pcVar24 = stbi__resample_row_generic;
                  }
                  *(code **)((long)&((stbi__gif *)(local_88a8.pal + -0xd))->w + lVar20) = pcVar24;
                }
                if (pvVar23 == (void *)0x0) goto LAB_0015c6b3;
                lVar20 = lVar20 + 0x30;
              } while ((ulong)uVar29 * 0x30 != lVar20);
            }
            psVar22 = psVar18->s;
            sVar15 = psVar22->img_y;
            local_8970 = stbi__malloc_mad3(req_comp,psVar22->img_x,sVar15,1);
            iVar14 = (int)extraout_RDX_16;
            if (local_8970 != (void *)0x0) {
              if (sVar15 != 0) {
                iVar45 = 0;
                uVar50 = 0;
                auVar33 = (undefined1  [8])extraout_RDX_16;
                do {
                  sVar15 = psVar22->img_x;
                  if (0 < (int)uVar29) {
                    pasVar47 = (stbi_uc (*) [4])&local_88a8.ratio;
                    uVar35 = 0;
                    piVar36 = &psVar18->img_comp[0].y;
                    do {
                      asVar4 = pasVar47[-1];
                      asVar5 = pasVar47[-3];
                      iVar14 = (int)asVar5 >> 1;
                      auVar52 = (**(code **)(pasVar47 + -10))
                                          (*(stbi_uc **)(piVar36 + 10),
                                           *(undefined8 *)
                                            (*pasVar47 +
                                            ((ulong)(iVar14 <= (int)asVar4) << 3 |
                                            0xffffffffffffffe0)),
                                           *(undefined8 *)
                                            (*pasVar47 +
                                            ((ulong)((int)asVar4 < iVar14) << 3 | 0xffffffffffffffe0
                                            )),pasVar47[-2]);
                      auVar33 = auVar52._8_8_;
                      *(long *)(local_8918 + uVar35 * 8) = auVar52._0_8_;
                      pasVar47[-1] = (stbi_uc  [4])((int)asVar4 + 1);
                      if ((int)asVar5 <= (int)asVar4 + 1) {
                        pasVar47[-1] = (stbi_uc  [4])0x0;
                        *(stbi_uc **)(pasVar47 + -8) = *(stbi_uc **)(pasVar47 + -6);
                        asVar4 = *pasVar47;
                        *pasVar47 = (stbi_uc  [4])((int)asVar4 + 1);
                        if ((int)asVar4 + 1 < *piVar36) {
                          *(stbi_uc **)(pasVar47 + -6) = *(stbi_uc **)(pasVar47 + -6) + piVar36[1];
                        }
                      }
                      uVar35 = uVar35 + 1;
                      piVar36 = piVar36 + 0x18;
                      pasVar47 = pasVar47 + 0xc;
                    } while (uVar29 != uVar35);
                  }
                  if (req_comp < 3) {
                    psVar22 = psVar18->s;
                    if (bVar51) {
                      if (req_comp == 1) {
                        if (psVar22->img_x != 0) {
                          uVar35 = 0;
                          do {
                            bVar12 = local_8908[uVar35];
                            *(char *)((long)local_8970 + uVar35 + sVar15 * iVar45) =
                                 (char)((uint)bVar12 * 2 + ((uint)bVar12 + (uint)bVar12 * 8) * 3 +
                                        (uint)uStack_8910[uVar35] * 0x96 +
                                        (uint)*(byte *)((long)local_8918 + uVar35) * 0x4d >> 8);
                            uVar35 = uVar35 + 1;
                            auVar33 = (undefined1  [8])uStack_8910;
                          } while (uVar35 < psVar22->img_x);
                        }
                      }
                      else if (psVar22->img_x != 0) {
                        uVar35 = 0;
                        do {
                          bVar12 = local_8908[uVar35];
                          *(char *)((long)local_8970 + uVar35 * 2 + (ulong)(sVar15 * iVar45)) =
                               (char)((uint)bVar12 * 2 + ((uint)bVar12 + (uint)bVar12 * 8) * 3 +
                                      (uint)uStack_8910[uVar35] * 0x96 +
                                      (uint)*(byte *)((long)local_8918 + uVar35) * 0x4d >> 8);
                          *(undefined1 *)
                           ((long)local_8970 + uVar35 * 2 + (ulong)(sVar15 * iVar45) + 1) = 0xff;
                          uVar35 = uVar35 + 1;
                          auVar33 = (undefined1  [8])uStack_8910;
                        } while (uVar35 < psVar22->img_x);
                      }
                    }
                    else if (psVar22->img_n == 4) {
                      if (psVar18->app14_color_transform == 2) {
                        if (psVar22->img_x != 0) {
                          puVar37 = (undefined1 *)((long)local_8970 + (ulong)(sVar15 * iVar45) + 1);
                          uVar35 = 0;
                          do {
                            iVar14 = (*(byte *)((long)local_8918 + uVar35) ^ 0xff) *
                                     (uint)uStack_8900[uVar35];
                            puVar37[-1] = (char)((iVar14 + 0x80U >> 8) + iVar14 + 0x80 >> 8);
                            *puVar37 = 0xff;
                            uVar35 = uVar35 + 1;
                            puVar37 = puVar37 + (uint)req_comp;
                            auVar33 = (undefined1  [8])uStack_8900;
                          } while (uVar35 < psVar22->img_x);
                        }
                      }
                      else {
                        if (psVar18->app14_color_transform != 0) goto LAB_0015cf63;
                        if (psVar22->img_x != 0) {
                          puVar37 = (undefined1 *)((long)local_8970 + (ulong)(sVar15 * iVar45) + 1);
                          uVar35 = 0;
                          do {
                            bVar12 = uStack_8900[uVar35];
                            iVar14 = (uint)*(byte *)((long)local_8918 + uVar35) * (uint)bVar12;
                            iVar44 = (uint)uStack_8910[uVar35] * (uint)bVar12;
                            puVar37[-1] = (char)(((uint)local_8908[uVar35] * (uint)bVar12 +
                                                  ((uint)local_8908[uVar35] * (uint)bVar12 + 0x80 >>
                                                  8) + 0x80 >> 8 & 0xff) * 0x1d +
                                                 (iVar44 + (iVar44 + 0x80U >> 8) + 0x80 >> 8 & 0xff)
                                                 * 0x96 + (iVar14 + (iVar14 + 0x80U >> 8) + 0x80 >>
                                                           8 & 0xff) * 0x4d >> 8);
                            *puVar37 = 0xff;
                            uVar35 = uVar35 + 1;
                            puVar37 = puVar37 + (uint)req_comp;
                            auVar33 = local_8918;
                          } while (uVar35 < psVar22->img_x);
                        }
                      }
                    }
                    else {
LAB_0015cf63:
                      uVar16 = psVar22->img_x;
                      auVar33 = (undefined1  [8])(ulong)uVar16;
                      if (req_comp == 1) {
                        if (uVar16 != 0) {
                          auVar33 = (undefined1  [8])0x0;
                          do {
                            *(stbi_uc *)
                             ((long)auVar33 + (long)local_8970 + (ulong)(sVar15 * iVar45)) =
                                 *(stbi_uc *)((long)local_8918 + (long)auVar33);
                            auVar33 = (undefined1  [8])((long)auVar33 + 1);
                          } while ((ulong)auVar33 < (stbi_uc *)(ulong)psVar22->img_x);
                        }
                      }
                      else if (uVar16 != 0) {
                        auVar33 = (undefined1  [8])0x0;
                        do {
                          *(stbi_uc *)
                           ((long)local_8970 + (long)auVar33 * 2 + (ulong)(sVar15 * iVar45)) =
                               *(stbi_uc *)((long)local_8918 + (long)auVar33);
                          *(undefined1 *)
                           ((long)local_8970 + (long)auVar33 * 2 + (ulong)(sVar15 * iVar45) + 1) =
                               0xff;
                          auVar33 = (undefined1  [8])((long)auVar33 + 1);
                        } while ((ulong)auVar33 < (stbi_uc *)(ulong)psVar22->img_x);
                      }
                    }
                  }
                  else {
                    psVar27 = (stbi_uc *)((long)local_8970 + (ulong)(uVar50 * req_comp * sVar15));
                    psVar22 = psVar18->s;
                    if (psVar22->img_n == 3) {
                      if (bVar51) {
                        if (psVar22->img_x != 0) {
                          puVar37 = (undefined1 *)((long)local_8970 + (ulong)(sVar15 * iVar45) + 3);
                          uVar35 = 0;
                          do {
                            puVar37[-3] = *(stbi_uc *)((long)local_8918 + uVar35);
                            puVar37[-2] = uStack_8910[uVar35];
                            puVar37[-1] = local_8908[uVar35];
                            *puVar37 = 0xff;
                            uVar35 = uVar35 + 1;
                            puVar37 = puVar37 + (uint)req_comp;
                            auVar33 = (undefined1  [8])local_8908;
                          } while (uVar35 < psVar22->img_x);
                        }
                      }
                      else {
LAB_0015cfd8:
                        (*psVar18->YCbCr_to_RGB_kernel)
                                  (psVar27,(stbi_uc *)local_8918,uStack_8910,local_8908,
                                   psVar22->img_x,req_comp);
                        auVar33 = (undefined1  [8])extraout_RDX_17;
                      }
                    }
                    else if (psVar22->img_n == 4) {
                      if (psVar18->app14_color_transform == 2) {
                        (*psVar18->YCbCr_to_RGB_kernel)
                                  (psVar27,(stbi_uc *)local_8918,uStack_8910,local_8908,
                                   psVar22->img_x,req_comp);
                        psVar22 = psVar18->s;
                        auVar33 = (undefined1  [8])extraout_RDX_18;
                        if (psVar22->img_x != 0) {
                          pbVar38 = (byte *)((long)local_8970 + (ulong)(sVar15 * iVar45) + 2);
                          auVar33 = (undefined1  [8])0x0;
                          do {
                            bVar12 = uStack_8900[(long)auVar33];
                            iVar14 = (pbVar38[-2] ^ 0xff) * (uint)bVar12;
                            pbVar38[-2] = (byte)((iVar14 + 0x80U >> 8) + iVar14 + 0x80 >> 8);
                            iVar14 = (pbVar38[-1] ^ 0xff) * (uint)bVar12;
                            pbVar38[-1] = (byte)((iVar14 + 0x80U >> 8) + iVar14 + 0x80 >> 8);
                            iVar14 = (*pbVar38 ^ 0xff) * (uint)bVar12;
                            *pbVar38 = (byte)((iVar14 + 0x80U >> 8) + iVar14 + 0x80 >> 8);
                            auVar33 = (undefined1  [8])((long)auVar33 + 1);
                            pbVar38 = pbVar38 + (uint)req_comp;
                          } while ((ulong)auVar33 < (stbi_uc *)(ulong)psVar22->img_x);
                        }
                      }
                      else {
                        if (psVar18->app14_color_transform != 0) goto LAB_0015cfd8;
                        if (psVar22->img_x != 0) {
                          puVar37 = (undefined1 *)((long)local_8970 + (ulong)(sVar15 * iVar45) + 3);
                          uVar35 = 0;
                          do {
                            bVar12 = uStack_8900[uVar35];
                            iVar14 = (uint)*(byte *)((long)local_8918 + uVar35) * (uint)bVar12;
                            puVar37[-3] = (char)((iVar14 + 0x80U >> 8) + iVar14 + 0x80 >> 8);
                            iVar14 = (uint)uStack_8910[uVar35] * (uint)bVar12;
                            puVar37[-2] = (char)((iVar14 + 0x80U >> 8) + iVar14 + 0x80 >> 8);
                            puVar37[-1] = (char)(((uint)local_8908[uVar35] * (uint)bVar12 + 0x80 >>
                                                 8) + (uint)local_8908[uVar35] * (uint)bVar12 + 0x80
                                                >> 8);
                            *puVar37 = 0xff;
                            uVar35 = uVar35 + 1;
                            puVar37 = puVar37 + (uint)req_comp;
                            auVar33 = (undefined1  [8])uStack_8910;
                          } while (uVar35 < psVar22->img_x);
                        }
                      }
                    }
                    else if (psVar22->img_x != 0) {
                      puVar37 = (undefined1 *)((long)local_8970 + (ulong)(sVar15 * iVar45) + 3);
                      psVar27 = (stbi_uc *)0x0;
                      do {
                        sVar11 = *(stbi_uc *)((long)local_8918 + (long)psVar27);
                        puVar37[-1] = sVar11;
                        puVar37[-2] = sVar11;
                        puVar37[-3] = sVar11;
                        *puVar37 = 0xff;
                        psVar27 = psVar27 + 1;
                        auVar33 = (undefined1  [8])(ulong)psVar22->img_x;
                        puVar37 = puVar37 + (uint)req_comp;
                      } while (psVar27 < (ulong)auVar33);
                    }
                  }
                  iVar14 = SUB84(auVar33,0);
                  uVar50 = uVar50 + 1;
                  psVar22 = psVar18->s;
                  iVar45 = iVar45 + req_comp;
                } while (uVar50 < psVar22->img_y);
              }
              stbi__free_jpeg_components(psVar18,psVar22->img_n,iVar14);
              psVar22 = psVar18->s;
              *local_88e8 = psVar22->img_x;
              *local_88e0 = psVar22->img_y;
              if (local_88d8 != (int *)0x0) {
                *local_88d8 = (uint)(2 < psVar22->img_n) * 2 + 1;
              }
              goto LAB_0015c6b3;
            }
            stbi__free_jpeg_components(psVar18,psVar22->img_n,iVar14);
            pcVar19 = "Out of memory";
            goto LAB_0015af29;
          }
          iVar14 = stbi__process_marker(psVar18,(uint)bVar12);
          uVar50 = extraout_EDX_00;
          if (iVar14 != 0) goto LAB_0015c354;
          goto LAB_0015c69b;
        }
        iVar14 = stbi__get16be(psVar18->s);
        psVar22 = psVar18->s;
        pbVar38 = psVar22->img_buffer;
        paVar32 = extraout_RDX_00;
        if (pbVar38 < psVar22->img_buffer_end) {
LAB_0015b0b4:
          psVar22->img_buffer = pbVar38 + 1;
          bVar12 = *pbVar38;
        }
        else {
          if (psVar22->read_from_callbacks != 0) {
            stbi__refill_buffer(psVar22);
            pbVar38 = psVar22->img_buffer;
            paVar32 = extraout_RDX_01;
            goto LAB_0015b0b4;
          }
          bVar12 = 0;
        }
        psVar18->scan_n = (uint)bVar12;
        if (((0xfb < (byte)(bVar12 - 5)) && ((int)(uint)bVar12 <= psVar18->s->img_n)) &&
           (iVar14 == (uint)bVar12 * 2 + 6)) {
          if (bVar12 != 0) {
            lVar20 = 0;
            do {
              psVar22 = psVar18->s;
              pbVar38 = psVar22->img_buffer;
              if (pbVar38 < psVar22->img_buffer_end) {
LAB_0015b12b:
                psVar22->img_buffer = pbVar38 + 1;
                uVar29 = (uint)*pbVar38;
              }
              else {
                if (psVar22->read_from_callbacks != 0) {
                  stbi__refill_buffer(psVar22);
                  pbVar38 = psVar22->img_buffer;
                  goto LAB_0015b12b;
                }
                uVar29 = 0;
              }
              psVar22 = psVar18->s;
              pbVar38 = psVar22->img_buffer;
              if (pbVar38 < psVar22->img_buffer_end) {
LAB_0015b166:
                psVar22->img_buffer = pbVar38 + 1;
                bVar12 = *pbVar38;
              }
              else {
                if (psVar22->read_from_callbacks != 0) {
                  stbi__refill_buffer(psVar22);
                  pbVar38 = psVar22->img_buffer;
                  goto LAB_0015b166;
                }
                bVar12 = 0;
              }
              uVar50 = psVar18->s->img_n;
              if ((int)uVar50 < 1) {
                uVar35 = 0;
              }
              else {
                uVar35 = 0;
                paVar32 = paVar1;
                do {
                  if (paVar32->id == uVar29) goto LAB_0015b199;
                  uVar35 = uVar35 + 1;
                  paVar32 = paVar32 + 1;
                } while (uVar50 != uVar35);
                uVar35 = (ulong)uVar50;
              }
LAB_0015b199:
              if ((uint)uVar35 == uVar50) goto LAB_0015c69b;
              uVar34 = uVar35 & 0xffffffff;
              paVar32 = (anon_struct_96_18_0d0905d3 *)(uVar34 * 0x60);
              psVar18->img_comp[uVar34].hd = (uint)(bVar12 >> 4);
              if (0x3f < bVar12) goto LAB_0015c68b;
              paVar32 = paVar1 + uVar34;
              paVar32->ha = bVar12 & 0xf;
              if (3 < (bVar12 & 0xf)) goto LAB_0015c68b;
              psVar18->order[lVar20] = (uint)uVar35;
              lVar20 = lVar20 + 1;
            } while (lVar20 < psVar18->scan_n);
          }
          psVar22 = psVar18->s;
          pbVar38 = psVar22->img_buffer;
          if (pbVar38 < psVar22->img_buffer_end) {
LAB_0015b22b:
            psVar22->img_buffer = pbVar38 + 1;
            uVar50 = (uint)*pbVar38;
          }
          else {
            if (psVar22->read_from_callbacks != 0) {
              stbi__refill_buffer(psVar22);
              pbVar38 = psVar22->img_buffer;
              paVar32 = extraout_RDX_02;
              goto LAB_0015b22b;
            }
            uVar50 = 0;
          }
          psVar18->spec_start = uVar50;
          psVar22 = psVar18->s;
          pbVar38 = psVar22->img_buffer;
          if (pbVar38 < psVar22->img_buffer_end) {
LAB_0015b26d:
            psVar22->img_buffer = pbVar38 + 1;
            uVar50 = (uint)*pbVar38;
          }
          else {
            if (psVar22->read_from_callbacks != 0) {
              stbi__refill_buffer(psVar22);
              pbVar38 = psVar22->img_buffer;
              paVar32 = extraout_RDX_03;
              goto LAB_0015b26d;
            }
            uVar50 = 0;
          }
          psVar18->spec_end = uVar50;
          psVar22 = psVar18->s;
          psVar27 = psVar22->img_buffer;
          if (psVar27 < psVar22->img_buffer_end) {
LAB_0015b2af:
            psVar22->img_buffer = psVar27 + 1;
            paVar32 = (anon_struct_96_18_0d0905d3 *)CONCAT71((int7)((ulong)paVar32 >> 8),*psVar27);
          }
          else {
            if (psVar22->read_from_callbacks != 0) {
              stbi__refill_buffer(psVar22);
              psVar27 = psVar22->img_buffer;
              paVar32 = extraout_RDX_04;
              goto LAB_0015b2af;
            }
            paVar32 = (anon_struct_96_18_0d0905d3 *)0x0;
          }
          psVar18->succ_high = (int)(((ulong)paVar32 & 0xff) >> 4);
          uVar50 = (uint)((ulong)paVar32 & 0xff) & 0xf;
          psVar18->succ_low = uVar50;
          iVar14 = psVar18->progressive;
          iVar45 = psVar18->spec_start;
          if (iVar14 == 0) {
            if ((iVar45 == 0) && (((byte)paVar32 < 0x10 && (((ulong)paVar32 & 0xf) == 0)))) {
              psVar18->spec_end = 0x3f;
LAB_0015b346:
              iVar45 = psVar18->scan_n;
              uVar35 = (ulong)(uint)psVar18->restart_interval;
              if (psVar18->restart_interval == 0) {
                uVar35 = 0x7fffffff;
              }
              psVar18->code_buffer = 0;
              psVar18->code_bits = 0;
              psVar18->nomore = 0;
              psVar18->img_comp[3].dc_pred = 0;
              psVar18->img_comp[2].dc_pred = 0;
              psVar18->img_comp[1].dc_pred = 0;
              psVar18->img_comp[0].dc_pred = 0;
              psVar18->marker = 0xff;
              uVar50 = (uint)uVar35;
              psVar18->todo = uVar50;
              psVar18->eob_run = 0;
              if (iVar14 == 0) {
                if (iVar45 == 1) {
                  iVar45 = psVar18->order[0];
                  uVar29 = psVar18->img_comp[iVar45].y + 7 >> 3;
                  iVar14 = 1;
                  local_8938 = (ulong)uVar29;
                  if (0 < (int)uVar29) {
                    uVar16 = paVar1[iVar45].x + 7 >> 3;
                    iVar44 = 0;
                    uVar30 = 0;
                    iVar14 = local_8960;
                    do {
                      if (0 < (int)uVar16) {
                        lVar20 = 0;
                        do {
                          iVar41 = stbi__jpeg_decode_block
                                             (psVar18,(short *)&local_88a8,
                                              (stbi__huffman *)
                                              psVar18->huff_dc[paVar1[iVar45].hd].fast,
                                              (stbi__huffman *)
                                              psVar18->huff_ac[paVar1[iVar45].ha].fast,
                                              psVar18->fast_ac[paVar1[iVar45].ha],iVar45,
                                              psVar18->dequant[paVar1[iVar45].tq]);
                          if (iVar41 == 0) {
                            bVar51 = false;
                            iVar14 = 0;
                            uVar35 = extraout_RDX_10;
                          }
                          else {
                            (*psVar18->idct_block_kernel)
                                      (paVar1[iVar45].data + lVar20 + iVar44 * paVar1[iVar45].w2,
                                       paVar1[iVar45].w2,(short *)&local_88a8);
                            iVar41 = psVar18->todo;
                            psVar18->todo = iVar41 + -1;
                            bVar51 = true;
                            uVar35 = extraout_RDX_11;
                            if (iVar41 < 2) {
                              if (psVar18->code_bits < 0x18) {
                                stbi__grow_buffer_unsafe(psVar18);
                                uVar35 = extraout_RDX_12;
                              }
                              if ((psVar18->marker & 0xf8) == 0xd0) {
                                psVar18->code_buffer = 0;
                                psVar18->code_bits = 0;
                                psVar18->nomore = 0;
                                psVar18->img_comp[3].dc_pred = 0;
                                psVar18->img_comp[2].dc_pred = 0;
                                psVar18->img_comp[1].dc_pred = 0;
                                psVar18->img_comp[0].dc_pred = 0;
                                psVar18->marker = 0xff;
                                iVar41 = psVar18->restart_interval;
                                uVar35 = 0x7fffffff;
                                if (iVar41 == 0) {
                                  iVar41 = 0x7fffffff;
                                }
                                psVar18->todo = iVar41;
                                psVar18->eob_run = 0;
                              }
                              else {
                                iVar14 = 1;
                                bVar51 = false;
                              }
                            }
                          }
                          uVar50 = (uint)uVar35;
                          local_8960 = iVar14;
                          if (!bVar51) goto LAB_0015c342;
                          lVar20 = lVar20 + 8;
                        } while ((ulong)uVar16 * 8 != lVar20);
                      }
                      uVar50 = (uint)uVar35;
                      uVar30 = uVar30 + 1;
                      iVar44 = iVar44 + 8;
                      local_8960 = iVar14;
                    } while (uVar30 != uVar29);
                    goto LAB_0015c0bd;
                  }
                }
                else {
                  iVar14 = 1;
                  if (0 < psVar18->img_mcu_y) {
                    iVar45 = 0;
                    do {
                      if (0 < psVar18->img_mcu_x) {
                        local_8960 = 0;
                        do {
                          if (0 < psVar18->scan_n) {
                            uVar34 = 0;
                            do {
                              local_8938 = uVar34;
                              iVar14 = psVar18->order[local_8938];
                              if (0 < psVar18->img_comp[iVar14].v) {
                                iVar44 = 0;
                                bVar51 = true;
                                do {
                                  iVar41 = paVar1[iVar14].h;
                                  if (0 < iVar41) {
                                    iVar31 = 0;
                                    do {
                                      iVar49 = paVar1[iVar14].v;
                                      iVar17 = stbi__jpeg_decode_block
                                                         (psVar18,(short *)&local_88a8,
                                                          (stbi__huffman *)
                                                          psVar18->huff_dc[paVar1[iVar14].hd].fast,
                                                          (stbi__huffman *)
                                                          psVar18->huff_ac[paVar1[iVar14].ha].fast,
                                                          psVar18->fast_ac[paVar1[iVar14].ha],iVar14
                                                          ,psVar18->dequant[paVar1[iVar14].tq]);
                                      uVar50 = (uint)extraout_RDX_14;
                                      if (iVar17 == 0) {
                                        uVar35 = extraout_RDX_14;
                                        if (!bVar51) goto LAB_0015c237;
                                        goto LAB_0015c32a;
                                      }
                                      (*psVar18->idct_block_kernel)
                                                (paVar1[iVar14].data +
                                                 (long)((iVar41 * local_8960 + iVar31) * 8) +
                                                 (long)((iVar49 * iVar45 + iVar44) *
                                                        paVar1[iVar14].w2 * 8),paVar1[iVar14].w2,
                                                 (short *)&local_88a8);
                                      iVar31 = iVar31 + 1;
                                      iVar41 = paVar1[iVar14].h;
                                      uVar35 = extraout_RDX_15;
                                    } while (iVar31 < iVar41);
                                  }
                                  iVar44 = iVar44 + 1;
                                  bVar51 = iVar44 < paVar1[iVar14].v;
                                } while (iVar44 < paVar1[iVar14].v);
                              }
LAB_0015c237:
                              uVar34 = local_8938 + 1;
                            } while ((long)(local_8938 + 1) < (long)psVar18->scan_n);
                          }
                          uVar50 = (uint)uVar35;
                          iVar44 = psVar18->todo;
                          psVar18->todo = iVar44 + -1;
                          iVar14 = 1;
                          if (iVar44 < 2) {
                            if (psVar18->code_bits < 0x18) {
                              stbi__grow_buffer_unsafe(psVar18);
                              uVar50 = extraout_EDX_02;
                            }
                            if ((psVar18->marker & 0xf8) != 0xd0) goto LAB_0015c342;
                            psVar18->code_buffer = 0;
                            psVar18->code_bits = 0;
                            psVar18->nomore = 0;
                            psVar18->img_comp[3].dc_pred = 0;
                            psVar18->img_comp[2].dc_pred = 0;
                            psVar18->img_comp[1].dc_pred = 0;
                            psVar18->img_comp[0].dc_pred = 0;
                            psVar18->marker = 0xff;
                            iVar14 = psVar18->restart_interval;
                            uVar35 = 0x7fffffff;
                            if (iVar14 == 0) {
                              iVar14 = 0x7fffffff;
                            }
                            psVar18->todo = iVar14;
                            psVar18->eob_run = 0;
                          }
                          local_8960 = local_8960 + 1;
                        } while (local_8960 < psVar18->img_mcu_x);
                      }
                      uVar50 = (uint)uVar35;
                      iVar14 = 1;
                      iVar45 = iVar45 + 1;
                    } while (iVar45 < psVar18->img_mcu_y);
                  }
                }
              }
              else if (iVar45 == 1) {
                local_88c0 = (long)psVar18->order[0];
                local_88cc = psVar18->img_comp[local_88c0].y + 7 >> 3;
                iVar14 = 1;
                if (0 < local_88cc) {
                  paVar32 = paVar1 + local_88c0;
                  iVar45 = psVar18->img_comp[local_88c0].x + 7 >> 3;
                  local_893c = 0;
                  local_88c8 = paVar32;
                  do {
                    if (0 < iVar45) {
                      iVar14 = 0;
                      do {
                        piVar36 = local_88b8;
                        psVar39 = paVar32->coeff + (paVar32->coeff_w * local_893c + iVar14) * 0x40;
                        uVar34 = (ulong)psVar18->spec_start;
                        if (uVar34 == 0) {
                          iVar44 = stbi__jpeg_decode_block_prog_dc
                                             (psVar18,psVar39,
                                              (stbi__huffman *)psVar18->huff_dc[paVar32->hd].fast,
                                              (int)local_88c0);
                          uVar35 = extraout_RDX_06;
                          if (iVar44 != 0) goto LAB_0015b918;
                          bVar51 = false;
                          local_8938 = 0;
                        }
                        else {
                          lVar20 = (long)paVar32->ha;
                          local_8960 = psVar18->succ_low;
                          iVar44 = psVar18->eob_run;
                          bVar12 = (byte)local_8960;
                          if (psVar18->succ_high == 0) {
                            if (iVar44 == 0) {
                              do {
                                if (psVar18->code_bits < 0x10) {
                                  stbi__grow_buffer_unsafe(psVar18);
                                }
                                sVar48 = psVar18->fast_ac[lVar20][psVar18->code_buffer >> 0x17];
                                uVar50 = (uint)sVar48;
                                iVar44 = (int)uVar34;
                                if (sVar48 == 0) {
                                  if (psVar18->code_bits < 0x10) {
                                    stbi__grow_buffer_unsafe(psVar18);
                                  }
                                  uVar50 = psVar18->code_buffer;
                                  uVar43 = (ulong)uVar50;
                                  uVar35 = (ulong)psVar18->huff_ac[lVar20].fast[uVar50 >> 0x17];
                                  if (uVar35 == 0xff) {
                                    lVar26 = 0;
                                    do {
                                      lVar40 = lVar26;
                                      lVar26 = lVar40 + 1;
                                    } while ((uint)piVar36[lVar20 * 0x1a4 + lVar40 + -0x11] <=
                                             uVar50 >> 0x10);
                                    iVar41 = psVar18->code_bits;
                                    if (lVar26 == 8) {
                                      psVar18->code_bits = iVar41 + -0x10;
                                      uVar42 = 0xffffffff;
                                    }
                                    else {
                                      uVar42 = 0xffffffff;
                                      if ((int)(lVar40 + 10) <= iVar41) {
                                        iVar31 = (uVar50 >> (0x17U - (char)lVar26 & 0x1f) &
                                                 stbi__bmask[lVar40 + 10]) +
                                                 piVar36[lVar20 * 0x1a4 + lVar26];
                                        bVar2 = psVar18->huff_ac[lVar20].size[iVar31];
                                        if ((uVar50 >> (-bVar2 & 0x1f) & stbi__bmask[bVar2]) !=
                                            (uint)psVar18->huff_ac[lVar20].code[iVar31])
                                        goto LAB_0015dee1;
                                        uVar50 = uVar50 << ((byte)(lVar40 + 10) & 0x1f);
                                        uVar43 = (ulong)uVar50;
                                        psVar18->code_bits = (iVar41 - (int)lVar26) + -9;
                                        psVar18->code_buffer = uVar50;
                                        uVar42 = (ulong)psVar18->huff_ac[lVar20].values[iVar31];
                                      }
                                    }
                                  }
                                  else {
                                    bVar2 = psVar18->huff_ac[lVar20].size[uVar35];
                                    uVar42 = 0xffffffff;
                                    if ((int)(uint)bVar2 <= psVar18->code_bits) {
                                      uVar50 = uVar50 << (bVar2 & 0x1f);
                                      uVar43 = (ulong)uVar50;
                                      psVar18->code_buffer = uVar50;
                                      psVar18->code_bits = psVar18->code_bits - (uint)bVar2;
                                      uVar42 = (ulong)psVar18->huff_ac[lVar20].values[uVar35];
                                    }
                                  }
                                  uVar50 = (uint)uVar42;
                                  if ((int)uVar50 < 0) {
                                    *(char **)(in_FS_OFFSET + -0x10) = "Corrupt JPEG";
                                    iVar41 = 1;
                                  }
                                  else {
                                    uVar35 = uVar42 >> 4;
                                    uVar29 = uVar50 & 0xf;
                                    if ((uVar42 & 0xf) != 0) {
                                      bVar2 = ""[(long)iVar44 + uVar35];
                                      if (psVar18->code_bits < (int)uVar29) {
                                        stbi__grow_buffer_unsafe(psVar18);
                                      }
                                      uVar50 = psVar18->code_buffer;
                                      uVar30 = uVar50 << (sbyte)uVar29 |
                                               uVar50 >> 0x20 - (sbyte)uVar29;
                                      uVar16 = *(uint *)((long)stbi__bmask + (ulong)(uVar29 * 4));
                                      psVar18->code_buffer = ~uVar16 & uVar30;
                                      psVar18->code_bits = psVar18->code_bits - uVar29;
                                      iVar41 = 0;
                                      iVar31 = 0;
                                      if (-1 < (int)uVar50) {
                                        iVar31 = *(int *)((long)stbi__jbias + (ulong)(uVar29 * 4));
                                      }
                                      iVar31 = (uVar30 & uVar16) + iVar31 << (bVar12 & 0x1f);
                                      uVar34 = (ulong)((int)((long)iVar44 + uVar35) + 1);
                                      psVar39[bVar2] = (short)iVar31;
                                      uVar35 = CONCAT71((uint7)(uint3)((uint)iVar31 >> 8),1);
                                      goto LAB_0015bcf2;
                                    }
                                    if (0xef < uVar50) {
                                      uVar29 = iVar44 + 0x10;
                                      goto LAB_0015ba6c;
                                    }
                                    psVar18->eob_run = 1 << ((byte)uVar35 & 0x1f);
                                    if (0xf < uVar50) {
                                      if (psVar18->code_bits < (int)uVar35) {
                                        stbi__grow_buffer_unsafe(psVar18);
                                      }
                                      bVar2 = (byte)uVar35 & 0x1f;
                                      uVar29 = psVar18->code_buffer << bVar2 |
                                               psVar18->code_buffer >> 0x20 - bVar2;
                                      uVar50 = stbi__bmask[uVar35];
                                      psVar18->code_buffer = ~uVar50 & uVar29;
                                      psVar18->code_bits = psVar18->code_bits - (int)uVar35;
                                      psVar18->eob_run = psVar18->eob_run + (uVar29 & uVar50);
                                    }
                                    psVar18->eob_run = psVar18->eob_run + -1;
                                    iVar41 = 2;
                                  }
                                  uVar35 = 0;
                                }
                                else {
                                  psVar18->code_buffer =
                                       psVar18->code_buffer << (sbyte)(uVar50 & 0xf);
                                  uVar43 = (ulong)(uVar50 >> 4 & 0xf);
                                  psVar18->code_bits = psVar18->code_bits - (uVar50 & 0xf);
                                  uVar29 = (int)((long)iVar44 + uVar43) + 1;
                                  psVar39[""[(long)iVar44 + uVar43]] =
                                       (short)((uVar50 >> 8) << (bVar12 & 0x1f));
LAB_0015ba6c:
                                  uVar34 = (ulong)uVar29;
                                  iVar41 = 0;
                                  uVar35 = CONCAT71((int7)(uVar43 >> 8),1);
                                }
LAB_0015bcf2:
                                bVar51 = false;
                                uVar43 = 1;
                                if (iVar41 != 0) {
                                  if (iVar41 != 2) {
                                    uVar43 = uVar35;
                                  }
                                  break;
                                }
                              } while ((int)uVar34 <= psVar18->spec_end);
                            }
                            else {
                              psVar18->eob_run = iVar44 + -1;
                              bVar51 = true;
                              uVar43 = 0;
                            }
                            if ((char)uVar43 != '\0') goto LAB_0015b8ee;
                          }
                          else {
                            if (iVar44 == 0) {
                              uVar50 = (0x10000 << (bVar12 & 0x1f)) >> 0x10;
                              do {
                                if (psVar18->code_bits < 0x10) {
                                  stbi__grow_buffer_unsafe(psVar18);
                                }
                                uVar29 = psVar18->code_buffer;
                                uVar35 = (ulong)uVar29;
                                uVar43 = (ulong)psVar18->huff_ac[lVar20].fast[uVar29 >> 0x17];
                                if (uVar43 == 0xff) {
                                  lVar26 = 0;
                                  do {
                                    lVar40 = lVar26;
                                    lVar26 = lVar40 + 1;
                                  } while ((uint)piVar36[lVar20 * 0x1a4 + lVar40 + -0x11] <=
                                           uVar29 >> 0x10);
                                  iVar44 = psVar18->code_bits;
                                  if (lVar26 == 8) {
                                    psVar18->code_bits = iVar44 + -0x10;
                                    uVar42 = 0xffffffff;
                                  }
                                  else {
                                    uVar42 = 0xffffffff;
                                    if ((int)(lVar40 + 10) <= iVar44) {
                                      iVar41 = (uVar29 >> (0x17U - (char)lVar26 & 0x1f) &
                                               stbi__bmask[lVar40 + 10]) +
                                               piVar36[lVar20 * 0x1a4 + lVar26];
                                      bVar2 = psVar18->huff_ac[lVar20].size[iVar41];
                                      if ((uVar29 >> (-bVar2 & 0x1f) & stbi__bmask[bVar2]) !=
                                          (uint)psVar18->huff_ac[lVar20].code[iVar41]) {
LAB_0015dee1:
                                        __assert_fail(
                                                  "(((j->code_buffer) >> (32 - h->size[c])) & stbi__bmask[h->size[c]]) == h->code[c]"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/extern/stb/stb_image.h"
                                                  ,0x81a,
                                                  "int stbi__jpeg_huff_decode(stbi__jpeg *, stbi__huffman *)"
                                                  );
                                      }
                                      uVar29 = uVar29 << ((byte)(lVar40 + 10) & 0x1f);
                                      uVar35 = (ulong)uVar29;
                                      psVar18->code_bits = (iVar44 - (int)lVar26) + -9;
                                      psVar18->code_buffer = uVar29;
                                      uVar42 = (ulong)psVar18->huff_ac[lVar20].values[iVar41];
                                    }
                                  }
                                }
                                else {
                                  bVar2 = psVar18->huff_ac[lVar20].size[uVar43];
                                  uVar42 = 0xffffffff;
                                  if ((int)(uint)bVar2 <= psVar18->code_bits) {
                                    uVar29 = uVar29 << (bVar2 & 0x1f);
                                    uVar35 = (ulong)uVar29;
                                    psVar18->code_buffer = uVar29;
                                    psVar18->code_bits = psVar18->code_bits - (uint)bVar2;
                                    uVar42 = (ulong)psVar18->huff_ac[lVar20].values[uVar43];
                                  }
                                }
                                uVar29 = (uint)uVar42;
                                if ((int)uVar29 < 0) {
                                  *(char **)(in_FS_OFFSET + -0x10) = "Corrupt JPEG";
                                  bVar51 = false;
                                }
                                else {
                                  uVar43 = uVar42 >> 4;
                                  if ((uVar29 & 0xf) == 1) {
                                    if (psVar18->code_bits < 1) {
                                      stbi__grow_buffer_unsafe(psVar18);
                                      uVar35 = extraout_RDX_07;
                                    }
                                    uVar29 = psVar18->code_buffer;
                                    psVar18->code_buffer = uVar29 * 2;
                                    psVar18->code_bits = psVar18->code_bits + -1;
                                    sVar48 = (short)(((int)~uVar29 >> 0x1f | 1U) << (bVar12 & 0x1f))
                                    ;
                                  }
                                  else {
                                    if ((uVar42 & 0xf) != 0) {
                                      *(char **)(in_FS_OFFSET + -0x10) = "Corrupt JPEG";
                                      bVar51 = false;
                                      goto LAB_0015b8d9;
                                    }
                                    if (uVar29 < 0xf0) {
                                      psVar18->eob_run = ~(-1 << ((byte)uVar43 & 0x1f));
                                      if (0xf < uVar29) {
                                        if (psVar18->code_bits < (int)uVar43) {
                                          stbi__grow_buffer_unsafe(psVar18);
                                        }
                                        bVar2 = (byte)uVar43 & 0x1f;
                                        uVar16 = psVar18->code_buffer << bVar2 |
                                                 psVar18->code_buffer >> 0x20 - bVar2;
                                        uVar29 = stbi__bmask[uVar43];
                                        uVar30 = ~uVar29 & uVar16;
                                        uVar35 = (ulong)uVar30;
                                        psVar18->code_buffer = uVar30;
                                        psVar18->code_bits = psVar18->code_bits - (int)uVar43;
                                        psVar18->eob_run = psVar18->eob_run + (uVar16 & uVar29);
                                      }
                                      sVar48 = 0;
                                      uVar43 = 0x40;
                                    }
                                    else {
                                      sVar48 = 0;
                                      uVar43 = 0xf;
                                    }
                                  }
                                  uVar34 = (ulong)(int)uVar34;
                                  do {
                                    if ((long)psVar18->spec_end < (long)uVar34) break;
                                    bVar2 = ""[uVar34];
                                    if (psVar39[bVar2] == 0) {
                                      if ((int)uVar43 == 0) {
                                        psVar39[bVar2] = sVar48;
                                        bVar51 = false;
                                        uVar43 = 0;
                                      }
                                      else {
                                        uVar43 = (ulong)((int)uVar43 - 1);
                                        bVar51 = true;
                                      }
                                    }
                                    else {
                                      if (psVar18->code_bits < 1) {
                                        stbi__grow_buffer_unsafe(psVar18);
                                        uVar35 = extraout_RDX_08;
                                      }
                                      sVar15 = psVar18->code_buffer;
                                      psVar18->code_buffer = sVar15 * 2;
                                      psVar18->code_bits = psVar18->code_bits + -1;
                                      bVar51 = true;
                                      if (((int)sVar15 < 0) &&
                                         (sVar3 = psVar39[bVar2], (uVar50 & (int)sVar3) == 0)) {
                                        uVar29 = uVar50;
                                        if (sVar3 < 1) {
                                          uVar29 = -uVar50;
                                        }
                                        psVar39[bVar2] = sVar3 + (short)uVar29;
                                      }
                                    }
                                    uVar34 = uVar34 + 1;
                                  } while (bVar51);
                                  bVar51 = true;
                                }
LAB_0015b8d9:
                                if (!bVar51) {
                                  bVar51 = false;
                                  goto LAB_0015b8f3;
                                }
                              } while ((int)uVar34 <= psVar18->spec_end);
                            }
                            else {
                              psVar18->eob_run = iVar44 + -1;
                              if (psVar18->spec_start <= psVar18->spec_end) {
                                uVar50 = (0x10000 << (bVar12 & 0x1f)) >> 0x10;
                                do {
                                  bVar12 = ""[uVar34];
                                  if (psVar39[bVar12] != 0) {
                                    if (psVar18->code_bits < 1) {
                                      stbi__grow_buffer_unsafe(psVar18);
                                      uVar35 = extraout_RDX_05;
                                    }
                                    sVar15 = psVar18->code_buffer;
                                    psVar18->code_buffer = sVar15 * 2;
                                    psVar18->code_bits = psVar18->code_bits + -1;
                                    if (((int)sVar15 < 0) &&
                                       (sVar48 = psVar39[bVar12], (uVar50 & (int)sVar48) == 0)) {
                                      uVar29 = -uVar50;
                                      if (0 < sVar48) {
                                        uVar29 = uVar50;
                                      }
                                      psVar39[bVar12] = (short)uVar29 + sVar48;
                                    }
                                  }
                                  bVar51 = (long)uVar34 < (long)psVar18->spec_end;
                                  uVar34 = uVar34 + 1;
                                } while (bVar51);
                              }
                            }
LAB_0015b8ee:
                            bVar51 = true;
                          }
LAB_0015b8f3:
                          if (!bVar51) {
                            local_8938._0_4_ = 0;
                          }
                          local_8938 = (ulong)(uint)local_8938;
                          paVar32 = local_88c8;
                          if (!bVar51) {
                            bVar51 = false;
                          }
                          else {
LAB_0015b918:
                            iVar44 = psVar18->todo;
                            psVar18->todo = iVar44 + -1;
                            bVar51 = true;
                            if (iVar44 < 2) {
                              if (psVar18->code_bits < 0x18) {
                                stbi__grow_buffer_unsafe(psVar18);
                                uVar35 = extraout_RDX_09;
                              }
                              if ((psVar18->marker & 0xf8) == 0xd0) {
                                psVar18->code_buffer = 0;
                                psVar18->code_bits = 0;
                                psVar18->nomore = 0;
                                psVar18->img_comp[3].dc_pred = 0;
                                psVar18->img_comp[2].dc_pred = 0;
                                psVar18->img_comp[1].dc_pred = 0;
                                psVar18->img_comp[0].dc_pred = 0;
                                psVar18->marker = 0xff;
                                iVar44 = psVar18->restart_interval;
                                uVar35 = 0x7fffffff;
                                if (iVar44 == 0) {
                                  iVar44 = 0x7fffffff;
                                }
                                psVar18->todo = iVar44;
                                psVar18->eob_run = 0;
                              }
                              else {
                                local_8938 = 1;
                                bVar51 = false;
                              }
                            }
                          }
                        }
                        uVar50 = (uint)uVar35;
                        if (!bVar51) {
                          iVar14 = (int)local_8938;
                          goto LAB_0015c342;
                        }
                        iVar14 = iVar14 + 1;
                      } while (iVar14 != iVar45);
                    }
                    uVar50 = (uint)uVar35;
                    iVar14 = 1;
                    local_893c = local_893c + 1;
                  } while (local_893c != local_88cc);
                }
              }
              else {
                iVar14 = 1;
                if (0 < psVar18->img_mcu_y) {
                  iVar14 = 0;
                  do {
                    if (0 < psVar18->img_mcu_x) {
                      iVar45 = 0;
                      do {
                        if (0 < psVar18->scan_n) {
                          lVar20 = 0;
                          do {
                            iVar44 = psVar18->order[lVar20];
                            if (0 < psVar18->img_comp[iVar44].v) {
                              iVar41 = 0;
                              bVar51 = true;
LAB_0015bf77:
                              iVar31 = paVar1[iVar44].h;
                              if (iVar31 < 1) goto LAB_0015bfd7;
                              iVar49 = 0;
                              while( true ) {
                                iVar31 = stbi__jpeg_decode_block_prog_dc
                                                   (psVar18,paVar1[iVar44].coeff +
                                                            (iVar31 * iVar45 + iVar49 +
                                                            (paVar1[iVar44].v * iVar14 + iVar41) *
                                                            paVar1[iVar44].coeff_w) * 0x40,
                                                    (stbi__huffman *)
                                                    psVar18->huff_dc[paVar1[iVar44].hd].fast,iVar44)
                                ;
                                uVar50 = (uint)extraout_RDX_13;
                                uVar35 = extraout_RDX_13;
                                if (iVar31 == 0) break;
                                iVar49 = iVar49 + 1;
                                iVar31 = paVar1[iVar44].h;
                                if (iVar31 <= iVar49) goto LAB_0015bfd7;
                              }
                              if (!bVar51) goto LAB_0015bff0;
LAB_0015c32a:
                              iVar14 = 0;
                              goto LAB_0015c342;
                            }
LAB_0015bff0:
                            lVar20 = lVar20 + 1;
                          } while (lVar20 < psVar18->scan_n);
                        }
                        uVar50 = (uint)uVar35;
                        iVar44 = psVar18->todo;
                        psVar18->todo = iVar44 + -1;
                        if (iVar44 < 2) {
                          if (psVar18->code_bits < 0x18) {
                            stbi__grow_buffer_unsafe(psVar18);
                            uVar50 = extraout_EDX_01;
                          }
                          if ((psVar18->marker & 0xf8) != 0xd0) goto LAB_0015c0bd;
                          psVar18->code_buffer = 0;
                          psVar18->code_bits = 0;
                          psVar18->nomore = 0;
                          psVar18->img_comp[3].dc_pred = 0;
                          psVar18->img_comp[2].dc_pred = 0;
                          psVar18->img_comp[1].dc_pred = 0;
                          psVar18->img_comp[0].dc_pred = 0;
                          psVar18->marker = 0xff;
                          iVar44 = psVar18->restart_interval;
                          uVar35 = 0x7fffffff;
                          if (iVar44 == 0) {
                            iVar44 = 0x7fffffff;
                          }
                          psVar18->todo = iVar44;
                          psVar18->eob_run = 0;
                        }
                        iVar45 = iVar45 + 1;
                      } while (iVar45 < psVar18->img_mcu_x);
                    }
                    uVar50 = (uint)uVar35;
                    iVar14 = iVar14 + 1;
                  } while (iVar14 < psVar18->img_mcu_y);
LAB_0015c0bd:
                  iVar14 = 1;
                }
              }
LAB_0015c342:
              if (iVar14 != 0) {
                if (psVar18->marker != 0xff) goto LAB_0015c354;
LAB_0015c361:
                do {
                  psVar22 = psVar18->s;
                  if ((psVar22->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0015c37d:
                    if (psVar22->img_buffer_end <= psVar22->img_buffer) goto LAB_0015c354;
                  }
                  else {
                    iVar14 = (*(psVar22->io).eof)(psVar22->io_user_data);
                    if (iVar14 != 0) {
                      if (psVar22->read_from_callbacks != 0) goto LAB_0015c37d;
                      goto LAB_0015c354;
                    }
                  }
                  psVar22 = psVar18->s;
                  psVar27 = psVar22->img_buffer;
                  if (psVar22->img_buffer_end <= psVar27) {
                    if (psVar22->read_from_callbacks == 0) goto LAB_0015c361;
                    stbi__refill_buffer(psVar22);
                    psVar27 = psVar22->img_buffer;
                  }
                  psVar22->img_buffer = psVar27 + 1;
                } while (*psVar27 != 0xff);
                psVar22 = psVar18->s;
                psVar27 = psVar22->img_buffer;
                if (psVar27 < psVar22->img_buffer_end) {
LAB_0015c3ef:
                  psVar22->img_buffer = psVar27 + 1;
                  sVar11 = *psVar27;
                }
                else {
                  if (psVar22->read_from_callbacks != 0) {
                    stbi__refill_buffer(psVar22);
                    psVar27 = psVar22->img_buffer;
                    goto LAB_0015c3ef;
                  }
                  sVar11 = '\0';
                }
                psVar18->marker = sVar11;
                goto LAB_0015c354;
              }
              goto LAB_0015c69b;
            }
          }
          else if (((iVar45 < 0x40) && (psVar18->spec_end < 0x40)) &&
                  ((iVar45 <= psVar18->spec_end && (((byte)paVar32 < 0xe0 && (uVar50 < 0xe))))))
          goto LAB_0015b346;
        }
LAB_0015c68b:
        uVar50 = (uint)paVar32;
        *(char **)(in_FS_OFFSET + -0x10) = "Corrupt JPEG";
      }
LAB_0015c69b:
      stbi__free_jpeg_components(psVar18,psVar18->s->img_n,uVar50);
    }
    else {
      pcVar19 = "Internal error";
LAB_0015af29:
      *(char **)(in_FS_OFFSET + -0x10) = pcVar19;
    }
    local_8970 = (void *)0x0;
LAB_0015c6b3:
    free(psVar18);
    return local_8970;
  }
  iVar14 = stbi__check_png_header(s);
  psVar21 = s->img_buffer_original;
  s->img_buffer = psVar21;
  s->img_buffer_end = s->img_buffer_original_end;
  if (iVar14 != 0) {
    if ((uint)req_comp < 5) {
      local_88a8._0_8_ = s;
      iVar14 = stbi__parse_png_file((stbi__png *)&local_88a8,0,req_comp);
      data_00 = (stbi__uint16 *)local_88a8.history;
      uVar28 = local_88a8._0_8_;
      psVar46 = (stbi__uint16 *)0x0;
      if (iVar14 != 0) {
        iVar14 = 8;
        if ((8 < local_88a8.flags) && (iVar14 = 0x10, local_88a8.flags != 0x10)) {
          pcVar19 = "PNG not supported: unsupported color depth";
          goto LAB_0015af7f;
        }
        ri->bits_per_channel = iVar14;
        local_88a8.history = (stbi_uc *)0x0;
        if ((req_comp != 0) && (iVar14 = *(int *)(local_88a8._0_8_ + 0xc), iVar14 != req_comp)) {
          if (local_88a8.flags < 9) {
            data_00 = (stbi__uint16 *)
                      stbi__convert_format
                                ((uchar *)data_00,iVar14,req_comp,*(stbi__uint32 *)local_88a8._0_8_,
                                 *(stbi__uint32 *)(local_88a8._0_8_ + 4));
          }
          else {
            data_00 = stbi__convert_format16
                                (data_00,iVar14,req_comp,*(stbi__uint32 *)local_88a8._0_8_,
                                 *(stbi__uint32 *)(local_88a8._0_8_ + 4));
          }
          *(int *)(uVar28 + 0xc) = req_comp;
          if (data_00 == (stbi__uint16 *)0x0) {
            return (void *)0x0;
          }
        }
        *local_88e8 = *(stbi__uint32 *)local_88a8._0_8_;
        *local_88e0 = *(stbi__uint32 *)(local_88a8._0_8_ + 4);
        psVar46 = data_00;
        if (local_88d8 != (int *)0x0) {
          *local_88d8 = *(int *)(local_88a8._0_8_ + 8);
        }
      }
      free(local_88a8.history);
      local_88a8.history = (stbi_uc *)0x0;
      free(local_88a8.background);
      local_88a8.background = (stbi_uc *)0x0;
      free(local_88a8.out);
      return psVar46;
    }
    pcVar19 = "Internal error";
    goto LAB_0015af7f;
  }
  if (psVar21 < s->img_buffer_original_end) {
LAB_0015c430:
    s->img_buffer = psVar21 + 1;
    if (*psVar21 == 'B') {
      psVar21 = s->img_buffer;
      if (s->img_buffer_end <= psVar21) {
        if (s->read_from_callbacks == 0) goto LAB_0015c54e;
        stbi__refill_buffer(s);
        psVar21 = s->img_buffer;
      }
      s->img_buffer = psVar21 + 1;
      if (*psVar21 == 'M') {
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        uVar50 = stbi__get16le(s);
        iVar14 = stbi__get16le(s);
        uVar50 = iVar14 << 0x10 | uVar50;
        if ((((uVar50 < 0x39) && ((0x100010000001000U >> ((ulong)uVar50 & 0x3f) & 1) != 0)) ||
            (uVar50 == 0x7c)) || (uVar50 == 0x6c)) {
          s->img_buffer = s->img_buffer_original;
          s->img_buffer_end = s->img_buffer_original_end;
          uStack_8900._4_4_ = 0xff;
          pvVar23 = stbi__bmp_parse_header(s,(stbi__bmp_data *)local_8918);
          uVar50 = (uint)uStack_8900;
          if (pvVar23 == (void *)0x0) {
            return (void *)0x0;
          }
          local_88ac = s->img_y;
          uVar29 = -local_88ac;
          if (0 < (int)local_88ac) {
            uVar29 = local_88ac;
          }
          s->img_y = uVar29;
          if ((0x1000000 < uVar29) || (uVar16 = s->img_x, 0x1000000 < uVar16)) {
            pcVar19 = "Very large image (corrupt?)";
            goto LAB_0015af7f;
          }
          uVar8 = local_8918._0_4_;
          if ((int)uStack_8910 == 0xc) {
            if ((int)local_8918._0_4_ < 0x18) {
              uVar35 = (ulong)(uint)(((local_8918._4_4_ - local_88f8) + -0x18) / 3);
            }
            else {
LAB_0015d2e4:
              uVar35 = 0;
            }
          }
          else {
            if (0xf < (int)local_8918._0_4_) goto LAB_0015d2e4;
            uVar35 = (ulong)(uint)(local_8918._4_4_ - (local_88f8 + (int)uStack_8910) >> 2);
          }
          local_8970._0_4_ = uStack_8900._4_4_;
          iVar14 = (int)uVar35;
          if (iVar14 == 0) {
            if (local_8918._4_4_ !=
                ((int)s->img_buffer - *(int *)&s->img_buffer_original) + s->callback_already_read) {
              __assert_fail("info.offset == s->callback_already_read + (int) (s->img_buffer - s->img_buffer_original)"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/extern/stb/stb_image.h"
                            ,0x1515,
                            "void *stbi__bmp_load(stbi__context *, int *, int *, int *, int, stbi__result_info *)"
                           );
            }
            if (s->img_buffer + ((long)s->callback_already_read - (long)s) + -0x38 ==
                (stbi_uc *)(long)(int)local_8918._4_4_) goto LAB_0015d358;
          }
          else {
LAB_0015d358:
            uVar30 = (uint)uStack_8900 ^ 0xff000000;
            s->img_n = 4 - (uint)((uint)uStack_8900 == 0 || local_8918._0_4_ == 0x18 && uVar30 == 0)
            ;
            iVar45 = req_comp;
            if (req_comp < 3) {
              iVar45 = s->img_n;
            }
            iVar44 = stbi__mad3sizes_valid(iVar45,uVar16,uVar29,0);
            if (iVar44 != 0) {
              uVar28 = 0;
              data_02 = (uchar *)stbi__malloc_mad3(iVar45,uVar16,uVar29,0);
              if (data_02 == (uchar *)0x0) {
                pcVar19 = "Out of memory";
                goto LAB_0015af7f;
              }
              if ((int)uVar8 < 0x10) {
                if (iVar14 < 0x101 && iVar14 != 0) {
                  if (0 < iVar14) {
                    uVar34 = 0;
                    do {
                      psVar27 = s->img_buffer;
                      if (psVar27 < s->img_buffer_end) {
LAB_0015d524:
                        s->img_buffer = psVar27 + 1;
                        sVar11 = *psVar27;
                      }
                      else {
                        if (s->read_from_callbacks != 0) {
                          stbi__refill_buffer(s);
                          psVar27 = s->img_buffer;
                          goto LAB_0015d524;
                        }
                        sVar11 = '\0';
                      }
                      local_88a8.pal[uVar34 - 0xd][2] = sVar11;
                      psVar27 = s->img_buffer;
                      if (psVar27 < s->img_buffer_end) {
LAB_0015d563:
                        s->img_buffer = psVar27 + 1;
                        sVar11 = *psVar27;
                      }
                      else {
                        if (s->read_from_callbacks != 0) {
                          stbi__refill_buffer(s);
                          psVar27 = s->img_buffer;
                          goto LAB_0015d563;
                        }
                        sVar11 = '\0';
                      }
                      local_88a8.pal[uVar34 - 0xd][1] = sVar11;
                      psVar27 = s->img_buffer;
                      if (psVar27 < s->img_buffer_end) {
LAB_0015d59e:
                        s->img_buffer = psVar27 + 1;
                        sVar11 = *psVar27;
                      }
                      else {
                        if (s->read_from_callbacks != 0) {
                          stbi__refill_buffer(s);
                          psVar27 = s->img_buffer;
                          goto LAB_0015d59e;
                        }
                        sVar11 = '\0';
                      }
                      local_88a8.pal[uVar34 - 0xd][0] = sVar11;
                      if ((int)uStack_8910 != 0xc) {
                        psVar27 = s->img_buffer;
                        if (s->img_buffer_end <= psVar27) {
                          if (s->read_from_callbacks == 0) goto LAB_0015d5e8;
                          stbi__refill_buffer(s);
                          psVar27 = s->img_buffer;
                        }
                        s->img_buffer = psVar27 + 1;
                      }
LAB_0015d5e8:
                      local_88a8.pal[uVar34 - 0xd][3] = 0xff;
                      uVar34 = uVar34 + 1;
                    } while (uVar35 != uVar34);
                  }
                  stbi__skip(s,(iVar14 * ((int)uStack_8910 == 0xc | 0xfffffffc) + local_8918._4_4_)
                               - ((int)uStack_8910 + local_88f8));
                  if (uVar8 == 8) {
                    uVar50 = s->img_x;
                  }
                  else if (uVar8 == 4) {
                    uVar50 = s->img_x + 1 >> 1;
                  }
                  else {
                    if (uVar8 != 1) goto LAB_0015d40b;
                    uVar50 = s->img_x + 7 >> 3;
                  }
                  local_8948 = -uVar50 & 3;
                  if (uVar8 == 1) {
                    if (0 < (int)s->img_y) {
                      iVar14 = 0;
                      iVar44 = 0;
                      do {
                        pbVar38 = s->img_buffer;
                        if (pbVar38 < s->img_buffer_end) {
LAB_0015d83d:
                          s->img_buffer = pbVar38 + 1;
                          uVar50 = (uint)*pbVar38;
                        }
                        else {
                          if (s->read_from_callbacks != 0) {
                            stbi__refill_buffer(s);
                            pbVar38 = s->img_buffer;
                            goto LAB_0015d83d;
                          }
                          uVar50 = 0;
                        }
                        uVar29 = 7;
                        sVar15 = 1;
                        do {
                          sVar6 = s->img_x;
                          if ((int)sVar6 <= (int)(sVar15 - 1)) break;
                          uVar35 = (ulong)((uVar50 >> (uVar29 & 0x1f) & 1) != 0);
                          data_02[iVar14] = local_88a8.pal[uVar35 - 0xd][0];
                          data_02[(long)iVar14 + 1] = local_88a8.pal[uVar35 - 0xd][1];
                          data_02[(long)iVar14 + 2] = local_88a8.pal[uVar35 - 0xd][2];
                          iVar41 = iVar14 + 3;
                          if (iVar45 == 4) {
                            data_02[(long)iVar14 + 3] = 0xff;
                            iVar41 = iVar14 + 4;
                          }
                          iVar14 = iVar41;
                          if (sVar15 != sVar6) {
                            if ((int)uVar29 < 1) {
                              pbVar38 = s->img_buffer;
                              if (pbVar38 < s->img_buffer_end) {
LAB_0015d8ec:
                                s->img_buffer = pbVar38 + 1;
                                uVar50 = (uint)*pbVar38;
                              }
                              else {
                                if (s->read_from_callbacks != 0) {
                                  stbi__refill_buffer(s);
                                  pbVar38 = s->img_buffer;
                                  goto LAB_0015d8ec;
                                }
                                uVar50 = 0;
                              }
                              uVar29 = 7;
                            }
                            else {
                              uVar29 = uVar29 - 1;
                            }
                          }
                          bVar51 = sVar15 != sVar6;
                          sVar15 = sVar15 + 1;
                        } while (bVar51);
                        stbi__skip(s,local_8948);
                        iVar44 = iVar44 + 1;
                      } while (iVar44 < (int)s->img_y);
                    }
                  }
                  else if (0 < (int)s->img_y) {
                    uVar35 = 0;
                    iVar14 = 0;
                    do {
                      if (0 < (int)s->img_x) {
                        iVar44 = 0;
                        do {
                          pbVar38 = s->img_buffer;
                          if (pbVar38 < s->img_buffer_end) {
LAB_0015d996:
                            s->img_buffer = pbVar38 + 1;
                            uVar50 = (uint)*pbVar38;
                          }
                          else {
                            if (s->read_from_callbacks != 0) {
                              stbi__refill_buffer(s);
                              pbVar38 = s->img_buffer;
                              goto LAB_0015d996;
                            }
                            uVar50 = 0;
                          }
                          uVar29 = uVar50 >> 4;
                          if (uVar8 != 4) {
                            uVar29 = uVar50;
                          }
                          uVar34 = (ulong)uVar29;
                          uVar50 = uVar50 & 0xf;
                          if (uVar8 != 4) {
                            uVar50 = 0;
                          }
                          iVar41 = (int)uVar35;
                          uVar29 = iVar41 + 3;
                          data_02[iVar41] = local_88a8.pal[uVar34 - 0xd][0];
                          data_02[(long)iVar41 + 1] = local_88a8.pal[uVar34 - 0xd][1];
                          data_02[(long)iVar41 + 2] = local_88a8.pal[uVar34 - 0xd][2];
                          if (iVar45 == 4) {
                            uVar29 = iVar41 + 4;
                            data_02[(long)iVar41 + 3] = 0xff;
                          }
                          sVar15 = s->img_x;
                          if (iVar44 + 1U == sVar15) {
LAB_0015da98:
                            uVar35 = (ulong)uVar29;
                          }
                          else {
                            if (uVar8 == 8) {
                              pbVar38 = s->img_buffer;
                              if (s->img_buffer_end <= pbVar38) {
                                if (s->read_from_callbacks == 0) {
                                  uVar50 = 0;
                                  goto LAB_0015da5f;
                                }
                                stbi__refill_buffer(s);
                                pbVar38 = s->img_buffer;
                              }
                              s->img_buffer = pbVar38 + 1;
                              uVar50 = (uint)*pbVar38;
                            }
LAB_0015da5f:
                            lVar20 = (long)(int)uVar29;
                            uVar35 = lVar20 + 3;
                            uVar34 = (ulong)uVar50;
                            data_02[lVar20] = local_88a8.pal[uVar34 - 0xd][0];
                            data_02[lVar20 + 1] = local_88a8.pal[uVar34 - 0xd][1];
                            data_02[lVar20 + 2] = local_88a8.pal[uVar34 - 0xd][2];
                            if (iVar45 == 4) {
                              uVar29 = uVar29 + 4;
                              data_02[lVar20 + 3] = 0xff;
                              goto LAB_0015da98;
                            }
                          }
                        } while ((iVar44 + 1U != sVar15) &&
                                (iVar44 = iVar44 + 2, iVar44 < (int)s->img_x));
                      }
                      stbi__skip(s,local_8948);
                      iVar14 = iVar14 + 1;
                    } while (iVar14 < (int)s->img_y);
                  }
                  goto LAB_0015ddda;
                }
LAB_0015d40b:
                free(data_02);
                goto LAB_0015d413;
              }
              stbi__skip(s,local_8918._4_4_ - ((int)uStack_8910 + local_88f8));
              if (uVar8 == 0x18) {
                iVar14 = -3;
LAB_0015d678:
                uVar29 = iVar14 * s->img_x & 3;
              }
              else {
                uVar29 = 0;
                if (uVar8 == 0x10) {
                  iVar14 = -2;
                  goto LAB_0015d678;
                }
              }
              iVar14 = 0;
              if (uVar8 == 0x18) {
                uVar35 = 0;
LAB_0015d6bc:
                bVar51 = false;
              }
              else {
                if (uVar8 != 0x20) {
                  uVar35 = CONCAT71((int7)((ulong)uVar28 >> 8),1);
                  goto LAB_0015d6bc;
                }
                uVar16 = (uint)local_8908 ^ 0xff00 | local_8908._4_4_ ^ 0xff;
                bVar51 = (uStack_8910._4_4_ == 0xff0000 && uVar16 == 0) && uVar30 == 0;
                uVar35 = (ulong)CONCAT31((int3)(uVar16 >> 8),
                                         (uStack_8910._4_4_ != 0xff0000 || uVar16 != 0) ||
                                         uVar30 != 0);
              }
              iVar44 = 0;
              iVar41 = 0;
              iVar31 = 0;
              uVar16 = 0;
              uVar30 = 0;
              bits = 0;
              local_88b8 = (int *)((ulong)local_88b8 & 0xffffffff00000000);
              local_88b0 = (uint)uVar35;
              if ((char)uVar35 == '\0') {
LAB_0015db27:
                bVar7 = true;
                if (0 < (int)s->img_y) {
                  iVar17 = 0;
                  iVar49 = 0;
                  local_88c8 = (anon_struct_96_18_0d0905d3 *)CONCAT44(local_88c8._4_4_,iVar41);
                  local_88c0 = CONCAT44(local_88c0._4_4_,iVar31);
                  local_88d0 = uVar29;
                  do {
                    local_88cc = iVar49;
                    if ((char)uVar35 == '\0') {
                      if (0 < (int)s->img_x) {
                        iVar41 = 0;
                        do {
                          puVar25 = s->img_buffer;
                          if (puVar25 < s->img_buffer_end) {
LAB_0015dc76:
                            s->img_buffer = puVar25 + 1;
                            uVar13 = *puVar25;
                          }
                          else {
                            if (s->read_from_callbacks != 0) {
                              stbi__refill_buffer(s);
                              puVar25 = s->img_buffer;
                              goto LAB_0015dc76;
                            }
                            uVar13 = '\0';
                          }
                          data_02[(long)iVar17 + 2] = uVar13;
                          puVar25 = s->img_buffer;
                          if (puVar25 < s->img_buffer_end) {
LAB_0015dcb9:
                            s->img_buffer = puVar25 + 1;
                            uVar13 = *puVar25;
                          }
                          else {
                            if (s->read_from_callbacks != 0) {
                              stbi__refill_buffer(s);
                              puVar25 = s->img_buffer;
                              goto LAB_0015dcb9;
                            }
                            uVar13 = '\0';
                          }
                          data_02[(long)iVar17 + 1] = uVar13;
                          puVar25 = s->img_buffer;
                          if (puVar25 < s->img_buffer_end) {
LAB_0015dcf9:
                            s->img_buffer = puVar25 + 1;
                            uVar13 = *puVar25;
                          }
                          else {
                            if (s->read_from_callbacks != 0) {
                              stbi__refill_buffer(s);
                              puVar25 = s->img_buffer;
                              goto LAB_0015dcf9;
                            }
                            uVar13 = '\0';
                          }
                          data_02[iVar17] = uVar13;
                          bVar12 = 0xff;
                          if (bVar51) {
                            pbVar38 = s->img_buffer;
                            if (s->img_buffer_end <= pbVar38) {
                              if (s->read_from_callbacks == 0) {
                                bVar12 = 0;
                                goto LAB_0015dd4b;
                              }
                              stbi__refill_buffer(s);
                              pbVar38 = s->img_buffer;
                            }
                            s->img_buffer = pbVar38 + 1;
                            bVar12 = *pbVar38;
                          }
LAB_0015dd4b:
                          iVar31 = iVar17 + 3;
                          if (iVar45 == 4) {
                            data_02[(long)iVar17 + 3] = bVar12;
                            iVar31 = iVar17 + 4;
                          }
                          iVar17 = iVar31;
                          local_8970._0_4_ = (uint)local_8970 | bVar12;
                          iVar41 = iVar41 + 1;
                        } while (iVar41 < (int)s->img_x);
                      }
                    }
                    else if (0 < (int)s->img_x) {
                      iVar41 = 0;
                      do {
                        uVar29 = stbi__get16le(s);
                        if (uVar8 != 0x10) {
                          iVar31 = stbi__get16le(s);
                          uVar29 = uVar29 | iVar31 << 0x10;
                        }
                        iVar31 = stbi__shiftsigned(uVar29 & uStack_8910._4_4_,iVar14,uVar16);
                        data_02[iVar17] = (uchar)iVar31;
                        iVar31 = stbi__shiftsigned(uVar29 & (uint)local_8908,iVar44,uVar30);
                        data_02[(long)iVar17 + 1] = (uchar)iVar31;
                        iVar31 = stbi__shiftsigned(uVar29 & local_8908._4_4_,(int)local_88c8,bits);
                        data_02[(long)iVar17 + 2] = (uchar)iVar31;
                        if (uVar50 == 0) {
                          uVar29 = 0xff;
                        }
                        else {
                          uVar29 = stbi__shiftsigned(uVar29 & uVar50,(int)local_88c0,(int)local_88b8
                                                    );
                        }
                        iVar31 = iVar17 + 3;
                        if (iVar45 == 4) {
                          data_02[(long)iVar17 + 3] = (uchar)uVar29;
                          iVar31 = iVar17 + 4;
                        }
                        iVar17 = iVar31;
                        local_8970._0_4_ = (uint)local_8970 | uVar29;
                        iVar41 = iVar41 + 1;
                      } while (iVar41 < (int)s->img_x);
                    }
                    stbi__skip(s,local_88d0);
                    iVar49 = local_88cc + 1;
                    uVar35 = (ulong)local_88b0;
                  } while (iVar49 < (int)s->img_y);
                  bVar7 = true;
                }
              }
              else {
                local_88d0 = uVar29;
                if (local_8908._4_4_ != 0 && ((uint)local_8908 != 0 && uStack_8910._4_4_ != 0)) {
                  iVar14 = stbi__high_bit(uStack_8910._4_4_);
                  uVar16 = stbi__bitcount(uStack_8910._4_4_);
                  iVar44 = stbi__high_bit((uint)local_8908);
                  uVar30 = stbi__bitcount((uint)local_8908);
                  iVar41 = stbi__high_bit(local_8908._4_4_);
                  local_88c8 = (anon_struct_96_18_0d0905d3 *)CONCAT44(local_88c8._4_4_,iVar41);
                  bits = stbi__bitcount(local_8908._4_4_);
                  iVar41 = stbi__high_bit(uVar50);
                  local_88c0 = CONCAT44(local_88c0._4_4_,iVar41);
                  uVar29 = stbi__bitcount(uVar50);
                  local_88b8 = (int *)CONCAT44(local_88b8._4_4_,uVar29);
                  if ((uVar29 < 9 && bits < 9) && (uVar30 < 9 && uVar16 < 9)) {
                    iVar14 = iVar14 + -7;
                    iVar44 = iVar44 + -7;
                    iVar41 = (int)local_88c8 + -7;
                    iVar31 = (int)local_88c0 + -7;
                    uVar35 = (ulong)local_88b0;
                    uVar29 = local_88d0;
                    goto LAB_0015db27;
                  }
                }
                free(data_02);
                *(char **)(in_FS_OFFSET + -0x10) = "Corrupt BMP";
                bVar7 = false;
              }
              if (!bVar7) {
                return (void *)0x0;
              }
LAB_0015ddda:
              if (((iVar45 == 4) && ((uint)local_8970 == 0)) &&
                 (iVar14 = s->img_x * s->img_y * 4, -1 < iVar14 + -1)) {
                lVar20 = (ulong)(iVar14 - 4) + 7;
                do {
                  data_02[lVar20 + -4] = 0xff;
                  lVar20 = lVar20 + -4;
                } while (3 < lVar20);
              }
              if (0 < (int)local_88ac) {
                uVar50 = (int)s->img_y >> 1;
                if (0 < (int)uVar50) {
                  uVar16 = s->img_x * iVar45;
                  uVar29 = (s->img_y - 1) * uVar16;
                  uVar35 = 0;
                  uVar34 = 0;
                  do {
                    if (0 < (int)uVar16) {
                      uVar43 = 0;
                      do {
                        uVar13 = data_02[uVar43 + uVar35];
                        data_02[uVar43 + uVar35] = data_02[uVar43 + uVar29];
                        data_02[uVar43 + uVar29] = uVar13;
                        uVar43 = uVar43 + 1;
                      } while (uVar16 != uVar43);
                    }
                    uVar34 = uVar34 + 1;
                    uVar29 = uVar29 - uVar16;
                    uVar35 = (ulong)((int)uVar35 + uVar16);
                  } while (uVar34 != uVar50);
                }
              }
              if ((iVar45 != req_comp && req_comp != 0) &&
                 (data_02 = stbi__convert_format(data_02,iVar45,req_comp,s->img_x,s->img_y),
                 data_02 == (uchar *)0x0)) {
                return (void *)0x0;
              }
              *local_88e8 = s->img_x;
              *local_88e0 = s->img_y;
              if (local_88d8 != (int *)0x0) {
                *local_88d8 = s->img_n;
                return data_02;
              }
              return data_02;
            }
          }
LAB_0015d413:
          pcVar19 = "Corrupt BMP";
          goto LAB_0015af7f;
        }
      }
    }
  }
  else if (s->read_from_callbacks != 0) {
    stbi__refill_buffer(s);
    psVar21 = s->img_buffer;
    goto LAB_0015c430;
  }
LAB_0015c54e:
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  iVar14 = stbi__gif_test(s);
  if (iVar14 != 0) {
    memset(&local_88a8,0,0x8870);
    psVar22 = (stbi__context *)stbi__gif_load_next(s,&local_88a8,local_88d8,0,psVar27);
    if (psVar22 == s) {
      psVar22 = (stbi__context *)0x0;
    }
    if (psVar22 == (stbi__context *)0x0) {
      if (local_88a8.out != (stbi_uc *)0x0) {
        free(local_88a8.out);
      }
      psVar22 = (stbi__context *)0x0;
    }
    else {
      *local_88e8 = local_88a8.w;
      *local_88e0 = local_88a8.h;
      if ((req_comp & 0xfffffffbU) != 0) {
        psVar22 = (stbi__context *)
                  stbi__convert_format((uchar *)psVar22,4,req_comp,local_88a8.w,local_88a8.h);
      }
    }
    free(local_88a8.history);
    free(local_88a8.background);
    return psVar22;
  }
  iVar14 = stbi__psd_test(s);
  if (iVar14 != 0) {
    pvVar23 = stbi__psd_load(s,(int *)local_88e8,(int *)local_88e0,local_88d8,req_comp,ri,bpc);
    return pvVar23;
  }
  iVar14 = stbi__pic_test(s);
  if (iVar14 != 0) {
    pvVar23 = stbi__pic_load(s,(int *)local_88e8,(int *)local_88e0,local_88d8,req_comp,ri_00);
    return pvVar23;
  }
  iVar14 = stbi__pnm_test(s);
  piVar36 = local_88d8;
  if (iVar14 != 0) {
    pvVar23 = stbi__pnm_load(s,(int *)local_88e8,(int *)local_88e0,local_88d8,req_comp,ri_00);
    return pvVar23;
  }
  iVar14 = stbi__hdr_test(s);
  psVar10 = local_88e0;
  psVar9 = local_88e8;
  if (iVar14 != 0) {
    data_01 = stbi__hdr_load(s,(int *)local_88e8,(int *)local_88e0,piVar36,req_comp,ri_00);
    if (req_comp == 0) {
      req_comp = *piVar36;
    }
    psVar27 = stbi__hdr_to_ldr(data_01,*psVar9,*psVar10,req_comp);
    return psVar27;
  }
  iVar14 = stbi__tga_test(s);
  if (iVar14 != 0) {
    pvVar23 = stbi__tga_load(s,(int *)local_88e8,(int *)local_88e0,piVar36,req_comp,ri_00);
    return pvVar23;
  }
  pcVar19 = "Image not of any known type, or corrupt";
LAB_0015af7f:
  *(char **)(in_FS_OFFSET + -0x10) = pcVar19;
  return (void *)0x0;
LAB_0015bfd7:
  iVar41 = iVar41 + 1;
  bVar51 = iVar41 < paVar1[iVar44].v;
  if (paVar1[iVar44].v <= iVar41) goto LAB_0015bff0;
  goto LAB_0015bf77;
LAB_0015c354:
  bVar12 = stbi__get_marker(psVar18);
  goto LAB_0015b01c;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #else
   STBI_NOTUSED(bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}